

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::VertexTextureTests::init(VertexTextureTests *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  GLenum GVar2;
  Context *pCVar3;
  uint uVar4;
  undefined4 uVar5;
  TestNode *pTVar6;
  TestNode *this_00;
  TestNode *pTVar7;
  TestNode *pTVar8;
  long *plVar9;
  long lVar10;
  long *extraout_RAX;
  long *plVar11;
  long lVar12;
  VertexTextureTests *pVVar13;
  string name;
  long local_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  VertexTextureTests *local_b8;
  anon_struct_16_2_3f8b7511 *local_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  TestNode *local_88;
  anon_struct_16_2_3f8b7511 *local_80;
  long *local_78 [2];
  long local_68 [2];
  uint local_54;
  TestNode *local_50;
  long local_48;
  TestNode *local_40;
  TestNode *local_38;
  
  pTVar6 = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pCVar3->m_testCtx,"2d","2D Vertex Texture Tests");
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e6f0;
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
  this_00 = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_00,pCVar3->m_testCtx,"cube","Cube Map Vertex Texture Tests");
  this_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e6f0;
  this_00[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar7 = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pCVar3->m_testCtx,"filtering",
             "2D Vertex Texture Filtering Tests");
  ((TestNode *)&pTVar7->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e6f0;
  ((TestNode *)&pTVar7[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar3;
  pTVar8 = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,pCVar3->m_testCtx,"wrap","2D Vertex Texture Wrap Tests");
  ((TestNode *)&pTVar8->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e6f0;
  ((TestNode *)&pTVar8[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar3;
  local_88 = pTVar7;
  local_50 = pTVar8;
  pTVar7 = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pCVar3->m_testCtx,"filtering",
             "Cube Map Vertex Texture Filtering Tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e6f0;
  pTVar7[1]._vptr_TestNode = (_func_int **)pCVar3;
  pTVar8 = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,pCVar3->m_testCtx,"wrap","Cube Map Vertex Texture Wrap Tests");
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e6f0;
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar3;
  tcu::TestNode::addChild(pTVar6,local_88);
  tcu::TestNode::addChild(pTVar6,local_50);
  local_38 = pTVar7;
  tcu::TestNode::addChild(this_00,pTVar7);
  local_40 = pTVar8;
  tcu::TestNode::addChild(this_00,pTVar8);
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  tcu::TestNode::addChild((TestNode *)this,this_00);
  lVar10 = 0;
  local_b8 = this;
  do {
    local_80 = init::minFilterModes + lVar10;
    uVar4 = 0x2122601;
    lVar12 = 0;
    local_48 = lVar10;
    do {
      local_b0 = init::magFilterModes + lVar12;
      local_140 = 8;
      local_54 = uVar4;
      do {
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_78,0x1aee929);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_78);
        local_a8 = &local_98;
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_98 = *plVar11;
          lStack_90 = plVar9[3];
        }
        else {
          local_98 = *plVar11;
          local_a8 = (long *)*plVar9;
        }
        local_a0 = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_a8);
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_108 = *plVar11;
          lStack_100 = plVar9[3];
          local_118 = &local_108;
        }
        else {
          local_108 = *plVar11;
          local_118 = (long *)*plVar9;
        }
        local_110 = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_118);
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_128 = *plVar11;
          lStack_120 = plVar9[3];
          local_138 = &local_128;
        }
        else {
          local_128 = *plVar11;
          local_138 = (long *)*plVar9;
        }
        local_130 = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_c8 = *plVar11;
          lStack_c0 = plVar9[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *plVar11;
          local_d8 = (long *)*plVar9;
        }
        local_d0 = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_f8 = &local_e8;
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_e8 = *plVar11;
          lStack_e0 = plVar9[3];
        }
        else {
          local_e8 = *plVar11;
          local_f8 = (long *)*plVar9;
        }
        local_f0 = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,local_128 + 1);
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if (local_a8 != &local_98) {
          operator_delete(local_a8,local_98 + 1);
        }
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
        pTVar6 = (TestNode *)operator_new(0xa0);
        pCVar3 = (this->super_TestCaseGroup).m_context;
        GVar1 = local_80->mode;
        GVar2 = local_b0->mode;
        uVar5 = *(undefined4 *)((long)&init::wrapModes[0].name + local_140);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar6,pCVar3->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_f8,
                   glcts::fixed_sample_locations_values + 1);
        pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
        pTVar6->_vptr_TestNode = (_func_int **)&PTR__Vertex2DTextureCase_02122610;
        *(GLenum *)&pTVar6[1].m_testCtx = GVar1;
        *(GLenum *)((long)&pTVar6[1].m_testCtx + 4) = GVar2;
        *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = uVar5;
        *(undefined4 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = uVar5;
        pTVar6[1].m_name._M_string_length = 0;
        pTVar6[1].m_name.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0;
        tcu::TestNode::addChild(local_88,pTVar6);
        this = local_b8;
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        local_140 = local_140 + 0x10;
      } while (local_140 != 0x38);
      lVar12 = 1;
      uVar4 = 0;
    } while ((local_54 & 1) != 0);
    lVar10 = local_48 + 1;
  } while (lVar10 != 6);
  lVar10 = 0;
  do {
    lVar12 = 8;
    do {
      local_118 = &local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,0x1aee929);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_118);
      local_138 = &local_128;
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_128 = *plVar11;
        lStack_120 = plVar9[3];
      }
      else {
        local_128 = *plVar11;
        local_138 = (long *)*plVar9;
      }
      local_130 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_c8 = *plVar11;
        lStack_c0 = plVar9[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar11;
        local_d8 = (long *)*plVar9;
      }
      local_d0 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_f8 = &local_e8;
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_e8 = *plVar11;
        lStack_e0 = plVar9[3];
      }
      else {
        local_e8 = *plVar11;
        local_f8 = (long *)*plVar9;
      }
      local_f0 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      pTVar6 = (TestNode *)operator_new(0xa0);
      pCVar3 = (local_b8->super_TestCaseGroup).m_context;
      GVar1 = init::wrapModes[lVar10].mode;
      uVar5 = *(undefined4 *)((long)&init::wrapModes[0].name + lVar12);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar6,pCVar3->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_f8,
                 glcts::fixed_sample_locations_values + 1);
      pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
      pTVar6->_vptr_TestNode = (_func_int **)&PTR__Vertex2DTextureCase_02122610;
      pTVar6[1].m_testCtx = (TestContext *)0x260100002703;
      *(GLenum *)&pTVar6[1].m_name._M_dataplus._M_p = GVar1;
      *(undefined4 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = uVar5;
      pTVar6[1].m_name._M_string_length = 0;
      pTVar6[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0;
      tcu::TestNode::addChild(local_50,pTVar6);
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x38);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  pVVar13 = local_b8;
  do {
    uVar5 = 0x2122601;
    lVar12 = 0;
    local_88 = (TestNode *)lVar10;
    do {
      local_80 = (anon_struct_16_2_3f8b7511 *)CONCAT44(local_80._4_4_,uVar5);
      local_b0 = init::magFilterModes + lVar12;
      local_140 = 8;
      do {
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_78,0x1aee929);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_78);
        local_a8 = &local_98;
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_98 = *plVar11;
          lStack_90 = plVar9[3];
        }
        else {
          local_98 = *plVar11;
          local_a8 = (long *)*plVar9;
        }
        local_a0 = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_a8);
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_108 = *plVar11;
          lStack_100 = plVar9[3];
          local_118 = &local_108;
        }
        else {
          local_108 = *plVar11;
          local_118 = (long *)*plVar9;
        }
        local_110 = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_118);
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_128 = *plVar11;
          lStack_120 = plVar9[3];
          local_138 = &local_128;
        }
        else {
          local_128 = *plVar11;
          local_138 = (long *)*plVar9;
        }
        local_130 = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
        local_d8 = &local_c8;
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_c8 = *plVar11;
          lStack_c0 = plVar9[3];
        }
        else {
          local_c8 = *plVar11;
          local_d8 = (long *)*plVar9;
        }
        local_d0 = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_f8 = &local_e8;
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_e8 = *plVar11;
          lStack_e0 = plVar9[3];
        }
        else {
          local_e8 = *plVar11;
          local_f8 = (long *)*plVar9;
        }
        local_f0 = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,local_128 + 1);
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if (local_a8 != &local_98) {
          operator_delete(local_a8,local_98 + 1);
        }
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
        pTVar6 = (TestNode *)operator_new(0xa0);
        pCVar3 = (pVVar13->super_TestCaseGroup).m_context;
        GVar1 = init::minFilterModes[lVar10].mode;
        GVar2 = local_b0->mode;
        uVar5 = *(undefined4 *)((long)&init::wrapModes[0].name + local_140);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar6,pCVar3->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_f8,
                   glcts::fixed_sample_locations_values + 1);
        pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
        pTVar6->_vptr_TestNode = (_func_int **)&PTR__VertexCubeTextureCase_02122648;
        *(GLenum *)&pTVar6[1].m_testCtx = GVar1;
        *(GLenum *)((long)&pTVar6[1].m_testCtx + 4) = GVar2;
        *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = uVar5;
        *(undefined4 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = uVar5;
        pTVar6[1].m_name._M_string_length = 0;
        pTVar6[1].m_name.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0;
        tcu::TestNode::addChild(local_38,pTVar6);
        pVVar13 = local_b8;
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        local_140 = local_140 + 0x10;
      } while (local_140 != 0x38);
      lVar12 = 1;
      uVar5 = 0;
    } while (((ulong)local_80 & 1) != 0);
    lVar10 = (long)local_88 + 1;
  } while (lVar10 != 6);
  lVar10 = 0;
  do {
    lVar12 = 8;
    do {
      local_118 = &local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,0x1aee929);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_118);
      local_138 = &local_128;
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_128 = *plVar11;
        lStack_120 = plVar9[3];
      }
      else {
        local_128 = *plVar11;
        local_138 = (long *)*plVar9;
      }
      local_130 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_c8 = *plVar11;
        lStack_c0 = plVar9[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar11;
        local_d8 = (long *)*plVar9;
      }
      local_d0 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_f8 = &local_e8;
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_e8 = *plVar11;
        lStack_e0 = plVar9[3];
      }
      else {
        local_e8 = *plVar11;
        local_f8 = (long *)*plVar9;
      }
      local_f0 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      pTVar6 = (TestNode *)operator_new(0xa0);
      pCVar3 = (local_b8->super_TestCaseGroup).m_context;
      GVar1 = init::wrapModes[lVar10].mode;
      uVar5 = *(undefined4 *)((long)&init::wrapModes[0].name + lVar12);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar6,pCVar3->m_testCtx,NODETYPE_SELF_VALIDATE,(char *)local_f8,
                 glcts::fixed_sample_locations_values + 1);
      pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
      pTVar6->_vptr_TestNode = (_func_int **)&PTR__VertexCubeTextureCase_02122648;
      pTVar6[1].m_testCtx = (TestContext *)0x260100002703;
      *(GLenum *)&pTVar6[1].m_name._M_dataplus._M_p = GVar1;
      *(undefined4 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = uVar5;
      pTVar6[1].m_name._M_string_length = 0;
      pTVar6[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0;
      tcu::TestNode::addChild(local_40,pTVar6);
      plVar9 = &local_e8;
      if (local_f8 != plVar9) {
        operator_delete(local_f8,local_e8 + 1);
        plVar9 = extraout_RAX;
      }
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x38);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  return (int)plVar9;
}

Assistant:

void VertexTextureTests::init (void)
{
	// 2D and cube map groups, and their filtering and wrap sub-groups.
	TestCaseGroup* const group2D				= new TestCaseGroup(m_context, "2d",			"2D Vertex Texture Tests");
	TestCaseGroup* const groupCube				= new TestCaseGroup(m_context, "cube",			"Cube Map Vertex Texture Tests");
	TestCaseGroup* const filteringGroup2D		= new TestCaseGroup(m_context, "filtering",		"2D Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroup2D			= new TestCaseGroup(m_context, "wrap",			"2D Vertex Texture Wrap Tests");
	TestCaseGroup* const filteringGroupCube		= new TestCaseGroup(m_context, "filtering",		"Cube Map Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroupCube			= new TestCaseGroup(m_context, "wrap",			"Cube Map Vertex Texture Wrap Tests");

	group2D->addChild(filteringGroup2D);
	group2D->addChild(wrapGroup2D);
	groupCube->addChild(filteringGroupCube);
	groupCube->addChild(wrapGroupCube);

	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE	},
		{ "repeat",		GL_REPEAT			},
		{ "mirror",		GL_MIRRORED_REPEAT	}
	};

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST	},
		{ "linear",		GL_LINEAR	}
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// 2D cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroup2D->addChild(new Vertex2DTextureCase(m_context,
															   name.c_str(), "",
															   minFilterModes[minFilter].mode,
															   magFilterModes[magFilter].mode,
															   wrapModes[wrapMode].mode,
															   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroup2D->addChild(new Vertex2DTextureCase(m_context,
														  name.c_str(), "",
														  GL_LINEAR_MIPMAP_LINEAR,
														  GL_LINEAR,
														  wrapModes[wrapSMode].mode,
														  wrapModes[wrapTMode].mode));
		}));

	// Cube map cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroupCube->addChild(new VertexCubeTextureCase(m_context,
																   name.c_str(), "",
																   minFilterModes[minFilter].mode,
																   magFilterModes[magFilter].mode,
																   wrapModes[wrapMode].mode,
																   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroupCube->addChild(new VertexCubeTextureCase(m_context,
															  name.c_str(), "",
															  GL_LINEAR_MIPMAP_LINEAR,
															  GL_LINEAR,
															  wrapModes[wrapSMode].mode,
															  wrapModes[wrapTMode].mode));
		}));
}